

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O1

void Ssw_FrmStop(Ssw_Frm_t *p)

{
  Vec_Ptr_t *__ptr;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pFrames);
  }
  __ptr = p->vAig2Frm;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (p != (Ssw_Frm_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Ssw_FrmStop( Ssw_Frm_t * p )
{
    if ( p->pFrames )
        Aig_ManStop( p->pFrames );
    Vec_PtrFree( p->vAig2Frm );
    ABC_FREE( p );
}